

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O3

void __thiscall qclab::qgates::SWAP<float>::SWAP(SWAP<float> *this,int *qubits)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *__assertion;
  
  (this->super_QGate2<float>).super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004ee350;
  uVar2 = *qubits;
  if ((int)uVar2 < 0) {
    __assertion = "qubits[0] >= 0";
  }
  else {
    uVar1 = qubits[1];
    if (-1 < (int)uVar1) {
      if (uVar2 != uVar1) {
        if (uVar1 < uVar2) {
          uVar2 = uVar1;
        }
        (this->qubits_)._M_elems[0] = uVar2;
        iVar3 = qubits[1];
        if (qubits[1] < *qubits) {
          iVar3 = *qubits;
        }
        (this->qubits_)._M_elems[1] = iVar3;
        return;
      }
      __assert_fail("qubits[0] != qubits[1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/qgates/SWAP.hpp"
                    ,0x3e,
                    "virtual void qclab::qgates::SWAP<float>::setQubits(const int *) [T = float]");
    }
    __assertion = "qubits[1] >= 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/qgates/SWAP.hpp"
                ,0x3d,"virtual void qclab::qgates::SWAP<float>::setQubits(const int *) [T = float]")
  ;
}

Assistant:

SWAP( const int* qubits )
        {
          setQubits( qubits ) ;
        }